

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::ComputePDBOutputDir
          (cmGeneratorTarget *this,string *kind,string *config,string *out)

{
  size_type sVar1;
  cmGlobalGenerator *pcVar2;
  bool bVar3;
  cmValue cVar4;
  string *in_base;
  string configProp;
  string propertyName;
  string configUpper;
  allocator<char> local_169;
  string local_168;
  undefined1 local_148 [48];
  cmAlphaNum local_118;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  if (kind->_M_string_length != 0) {
    local_118.View_._M_str = (kind->_M_dataplus)._M_p;
    local_148._0_8_ = &DAT_00000011;
    local_148._8_8_ = "_OUTPUT_DIRECTORY";
    local_118.View_._M_len = kind->_M_string_length;
    cmStrCat<>(&local_168,&local_118,(cmAlphaNum *)local_148);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
  }
  std::__cxx11::string::string((string *)&local_168,(string *)config);
  cmsys::SystemTools::UpperCase(&local_68,&local_168);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  if (kind->_M_string_length != 0) {
    local_118.View_._M_str = (kind->_M_dataplus)._M_p;
    local_148._0_8_ = (pointer)0x12;
    local_148._8_8_ = "_OUTPUT_DIRECTORY_";
    local_118.View_._M_len = kind->_M_string_length;
    cmStrCat<std::__cxx11::string>(&local_48,&local_118,(cmAlphaNum *)local_148,&local_68);
    std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  cVar4 = GetProperty(this,&local_e8);
  if (cVar4.Value == (string *)0x0) {
    cVar4 = GetProperty(this,&local_c8);
    if (cVar4.Value == (string *)0x0) goto LAB_003d65b9;
    std::__cxx11::string::string((string *)&local_a8,(string *)cVar4.Value);
    local_148._0_8_ = local_148 + 0x10;
    local_148._8_8_ = (char *)0x0;
    local_148[0x10] = '\0';
    cmGeneratorExpression::Evaluate
              ((string *)&local_118,&local_a8,this->LocalGenerator,config,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,(string *)local_148);
    std::__cxx11::string::operator=((string *)out,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)local_148);
    std::__cxx11::string::~string((string *)&local_a8);
    bVar3 = std::operator!=(out,cVar4.Value);
    if (!bVar3) goto LAB_003d65b9;
  }
  else {
    std::__cxx11::string::string((string *)&local_88,(string *)cVar4.Value);
    local_148._0_8_ = local_148 + 0x10;
    local_148._8_8_ = (char *)0x0;
    local_148[0x10] = '\0';
    cmGeneratorExpression::Evaluate
              ((string *)&local_118,&local_88,this->LocalGenerator,config,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,(string *)local_148);
    std::__cxx11::string::operator=((string *)out,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)local_148);
    std::__cxx11::string::~string((string *)&local_88);
  }
  local_168._M_string_length = 0;
  *local_168._M_dataplus._M_p = '\0';
LAB_003d65b9:
  sVar1 = out->_M_string_length;
  if (sVar1 != 0) {
    in_base = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
    cmsys::SystemTools::CollapseFullPath((string *)&local_118,out,in_base);
    std::__cxx11::string::operator=((string *)out,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    if (local_168._M_string_length != 0) {
      pcVar2 = this->LocalGenerator->GlobalGenerator;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"/",(allocator<char> *)&local_48);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_148,"",&local_169);
      (*pcVar2->_vptr_cmGlobalGenerator[0x18])(pcVar2,&local_118,&local_168,local_148,out);
      std::__cxx11::string::~string((string *)local_148);
      std::__cxx11::string::~string((string *)&local_118);
    }
  }
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_c8);
  return sVar1 != 0;
}

Assistant:

bool cmGeneratorTarget::ComputePDBOutputDir(const std::string& kind,
                                            const std::string& config,
                                            std::string& out) const
{
  // Look for a target property defining the target output directory
  // based on the target type.
  std::string propertyName;
  if (!kind.empty()) {
    propertyName = cmStrCat(kind, "_OUTPUT_DIRECTORY");
  }
  std::string conf = config;

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  std::string configProp;
  if (!kind.empty()) {
    configProp = cmStrCat(kind, "_OUTPUT_DIRECTORY_", configUpper);
  }

  // Select an output directory.
  if (cmValue config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    out = cmGeneratorExpression::Evaluate(*config_outdir, this->LocalGenerator,
                                          config);

    // Skip per-configuration subdirectory.
    conf.clear();
  } else if (cmValue outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    out =
      cmGeneratorExpression::Evaluate(*outdir, this->LocalGenerator, config);

    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != *outdir) {
      conf.clear();
    }
  }
  if (out.empty()) {
    return false;
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, "", out);
  }
  return true;
}